

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O1

string_view __thiscall
slang::DiagnosticClient::getSourceLine(DiagnosticClient *this,SourceLocation location,size_t col)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar5;
  char *pcVar6;
  string_view sVar7;
  char *pcVar4;
  
  sVar7 = SourceManager::getSourceText(this->sourceManager,(BufferID)(location._0_4_ & 0xfffffff));
  sVar3 = sVar7._M_len;
  if (sVar3 == 0) {
    pcVar5 = "";
    sVar3 = 0;
  }
  else {
    pcVar5 = sVar7._M_str + (((ulong)location >> 0x1c) - col) + 1;
    pcVar6 = sVar7._M_str + (sVar3 - 1);
    pcVar4 = pcVar5;
    if (pcVar5 != pcVar6) {
      lVar1 = ((sVar3 + col) - ((ulong)location >> 0x1c)) + -2;
      pcVar2 = pcVar5;
      do {
        pcVar4 = pcVar2;
        if ((*pcVar2 == '\n') || (*pcVar2 == '\r')) break;
        pcVar2 = pcVar2 + 1;
        lVar1 = lVar1 + -1;
        pcVar4 = pcVar6;
      } while (lVar1 != 0);
    }
    sVar3 = (long)pcVar4 - (long)pcVar5;
  }
  sVar7._M_str = pcVar5;
  sVar7._M_len = sVar3;
  return sVar7;
}

Assistant:

std::string_view DiagnosticClient::getSourceLine(SourceLocation location, size_t col) const {
    std::string_view text = sourceManager->getSourceText(location.buffer());
    if (text.empty())
        return "";

    const char* start = text.data() + location.offset() - (col - 1);
    const char* curr = start;
    const char* end = text.data() + text.size() - 1;
    while (curr != end && *curr != '\n' && *curr != '\r')
        curr++;

    return std::string_view(start, (size_t)(curr - start));
}